

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::MILSpec::Dimension::ByteSizeLong(Dimension *this)

{
  bool bVar1;
  DimensionCase DVar2;
  int size;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  Dimension *this_local;
  
  _cached_size = 0;
  DVar2 = dimension_case(this);
  if (DVar2 != DIMENSION_NOT_SET) {
    if (DVar2 == kConstant) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                               ((this->dimension_).constant_);
      _cached_size = _cached_size + 1;
    }
    else if (DVar2 == kUnknown) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::MILSpec::Dimension_UnknownDimension>
                               ((this->dimension_).unknown_);
      _cached_size = _cached_size + 1;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t Dimension::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Dimension)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (dimension_case()) {
    // .CoreML.Specification.MILSpec.Dimension.ConstantDimension constant = 1;
    case kConstant: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *dimension_.constant_);
      break;
    }
    // .CoreML.Specification.MILSpec.Dimension.UnknownDimension unknown = 2;
    case kUnknown: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *dimension_.unknown_);
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}